

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X11MiniFB.c
# Opt level: O0

void mfb_get_monitor_scale(mfb_window *window,float *scale_x,float *scale_y)

{
  float y;
  float x;
  float *scale_y_local;
  float *scale_x_local;
  mfb_window *window_local;
  
  if (scale_x != (float *)0x0) {
    *scale_x = 1.0;
    if ((*scale_x == 0.0) && (!NAN(*scale_x))) {
      *scale_x = 1.0;
    }
  }
  if (scale_y != (float *)0x0) {
    *scale_y = 1.0;
    if ((*scale_y == 0.0) && (!NAN(*scale_y))) {
      *scale_y = 1.0;
    }
  }
  return;
}

Assistant:

void
mfb_get_monitor_scale(struct mfb_window *window, float *scale_x, float *scale_y) {
    float x = 96.0, y = 96.0;

    if(window != 0x0) {
        //SWindowData     *window_data     = (SWindowData *) window;
        //SWindowData_X11 *window_data_x11 = (SWindowData_X11 *) window_data->specific;

        // I cannot find a way to get dpi under VirtualBox
        // XrmGetResource "Xft.dpi", "Xft.Dpi"
        // XRRGetOutputInfo
        // DisplayWidthMM, DisplayHeightMM
        // All returning invalid values or 0
    }

    if (scale_x) {
        *scale_x = x / 96.0f;
        if(*scale_x == 0) {
            *scale_x = 1.0f;
        }
    }

    if (scale_y) {
        *scale_y = y / 96.0f;
        if (*scale_y == 0) {
            *scale_y = 1.0f;
        }
    }
}